

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMoveToSr<(moira::Instr)76,(moira::Mode)6,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  undefined1 local_38 [8];
  Ea<(moira::Mode)6,_2> src;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  src.ext2._2_2_ = op;
  unique0x10000136 = addr;
  Op<(moira::Mode)6,2>((Ea<(moira::Mode)6,_2> *)local_38,this,op & 7,addr);
  if (str->style->syntax == MUSASHI) {
    pSVar1 = StrWriter::operator<<(str);
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
    pSVar1 = StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)6,_2> *)local_38);
    pSVar1 = StrWriter::operator<<(pSVar1);
    StrWriter::operator<<(pSVar1);
  }
  else {
    pSVar1 = StrWriter::operator<<(str);
    pSVar1 = StrWriter::operator<<(pSVar1);
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
    pSVar1 = StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)6,_2> *)local_38);
    pSVar1 = StrWriter::operator<<(pSVar1);
    StrWriter::operator<<(pSVar1);
  }
  return;
}

Assistant:

void
Moira::dasmMoveToSr(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S> ( _____________xxx(op), addr );

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << str.tab << src << Sep{} << Sr{};
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << Sr{};
    }
}